

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

string * __thiscall
glcts::ViewportArray::DrawMulitpleViewportsWithSingleInvocation::getFragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,DrawMulitpleViewportsWithSingleInvocation *this)

{
  GLchar *__s;
  allocator<char> local_1a;
  undefined1 local_19;
  DrawMulitpleViewportsWithSingleInvocation *local_18;
  DrawMulitpleViewportsWithSingleInvocation *this_local;
  string *result;
  
  __s = getFragmentShader::source;
  local_19 = 0;
  local_18 = this;
  this_local = (DrawMulitpleViewportsWithSingleInvocation *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_1a)
  ;
  std::allocator<char>::~allocator(&local_1a);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawMulitpleViewportsWithSingleInvocation::getFragmentShader()
{
	static const GLchar* source = "${VERSION}\n"
								  "\n"
								  "flat in  int gs_fs_color;\n"
								  "     out int fs_out_color;\n"
								  "\n"
								  "void main()\n"
								  "{\n"
								  "    fs_out_color = gs_fs_color;\n"
								  "}\n"
								  "\n";

	std::string result = source;

	return result;
}